

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_bnot(CTcPrsNode *subexpr)

{
  int iVar1;
  tc_constval_type_t tVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CTPNBNot *in_RDI;
  CTcPrsNode *in_stack_ffffffffffffffc8;
  CTPNBNot *local_8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x256f53);
  if (iVar1 == 0) {
    local_8 = (CTPNBNot *)CTcPrsAllocObj::operator_new(0x256fd5);
    CTPNBNot::CTPNBNot(local_8,in_stack_ffffffffffffffc8);
  }
  else {
    iVar1 = (*(in_RDI->super_CTPNUnary).super_CTPNUnaryBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[1])();
    tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar1));
    local_8 = in_RDI;
    if (tVar2 == TC_CVT_INT) {
      iVar1 = (*(in_RDI->super_CTPNUnary).super_CTPNUnaryBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                _vptr_CTcPrsNodeBase[1])();
      iVar3 = (*(in_RDI->super_CTPNUnary).super_CTPNUnaryBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                _vptr_CTcPrsNodeBase[1])();
      uVar5 = CTcConstVal::get_val_int((CTcConstVal *)CONCAT44(extraout_var_01,iVar3));
      CTcConstVal::set_int
                ((CTcConstVal *)CONCAT44(extraout_var_00,iVar1),uVar5 ^ 0xffffffffffffffff);
    }
    else {
      pcVar4 = CTcTokenizer::get_op_text(TOKT_BNOT);
      CTcTokenizer::log_error(0x2b01,pcVar4);
    }
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_bnot(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* we need an integer - log an error if it's not */
        if (subexpr->get_const_val()->get_type() != TC_CVT_INT)
            G_tok->log_error(TCERR_CONST_UNARY_REQ_NUM,
                             G_tok->get_op_text(TOKT_BNOT));
        else
            subexpr->get_const_val()
                ->set_int(~subexpr->get_const_val()->get_val_int());

        /* return the updated value */
        return subexpr;
    }
    
    /* create the bitwise NOT node */
    return new CTPNBNot(subexpr);
}